

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O0

bool __thiscall
QGraphicsScenePrivate::filterDescendantEvent
          (QGraphicsScenePrivate *this,QGraphicsItem *item,QEvent *event)

{
  uint uVar1;
  QGraphicsItemPrivate *pQVar2;
  undefined8 in_RDX;
  long in_RSI;
  QGraphicsItem *parent;
  QGraphicsItem *local_28;
  
  if ((in_RSI != 0) &&
     (pQVar2 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
               operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                           *)(in_RSI + 8)), (*(ulong *)&pQVar2->field_0x160 & 0x80000) != 0)) {
    local_28 = QGraphicsItem::parentItem((QGraphicsItem *)0x9c7466);
    while (local_28 != (QGraphicsItem *)0x0) {
      pQVar2 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
               operator->(&local_28->d_ptr);
      if (((*(ulong *)&pQVar2->field_0x160 >> 0x3d & 1) != 0) &&
         (uVar1 = (*local_28->_vptr_QGraphicsItem[0xc])(local_28,in_RSI,in_RDX), (uVar1 & 1) != 0))
      {
        return true;
      }
      pQVar2 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
               operator->(&local_28->d_ptr);
      if ((*(ulong *)&pQVar2->field_0x160 & 0x80000) == 0) {
        return false;
      }
      local_28 = QGraphicsItem::parentItem((QGraphicsItem *)0x9c74e7);
    }
  }
  return false;
}

Assistant:

bool QGraphicsScenePrivate::filterDescendantEvent(QGraphicsItem *item, QEvent *event)
{
    if (item && (item->d_ptr->ancestorFlags & QGraphicsItemPrivate::AncestorFiltersChildEvents)) {
        QGraphicsItem *parent = item->parentItem();
        while (parent) {
            if (parent->d_ptr->filtersDescendantEvents && parent->sceneEventFilter(item, event))
                return true;
            if (!(parent->d_ptr->ancestorFlags & QGraphicsItemPrivate::AncestorFiltersChildEvents))
                return false;
            parent = parent->parentItem();
        }
    }
    return false;
}